

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O2

PAL_ERROR PAL_Enter(PAL_Boundary boundary)

{
  PAL_ERROR PVar1;
  CPalThread *this;
  PAL_Boundary in_ESI;
  CPalThread *local_28;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00327694;
  this = CorUnix::InternalGetCurrentThread();
  if (this == (CPalThread *)0x0) {
    if (boundary != PAL_BoundaryTop) {
      fprintf(_stderr,"] %s %s:%d","PAL_Enter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0x41);
      fprintf(_stderr,
              "Expression: PAL_BoundaryTop == boundary, Description: How are we entering a PAL thread for the first time not from the top? (boundary=%u)"
              ,boundary);
    }
    PVar1 = AllocatePalThread(&local_28);
    if (PVar1 == 0) goto LAB_0032762a;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_00327694;
  }
  else {
    CorUnix::CPalThread::Enter(this,in_ESI);
LAB_0032762a:
    PVar1 = 0;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return PVar1;
  }
LAB_00327694:
  abort();
}

Assistant:

PAL_ERROR
PALAPI
PAL_Enter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Enter(boundary=%u)\n", boundary);

    PAL_ERROR palError = ERROR_SUCCESS;
    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread != NULL)
    {
        palError = pThread->Enter(boundary);
    }
    else
    {
        // If this assert fires, we'll have to pipe this information so that
        // CPalThread's RunPostCreateInitializers call to SEHEnable
        // can know what direction.
        _ASSERT_MSG(PAL_BoundaryTop == boundary, "How are we entering a PAL "
            "thread for the first time not from the top? (boundary=%u)", boundary);

        palError = AllocatePalThread(&pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to allocate pal thread: error %d\n", palError);
        }
    }

    LOGEXIT("PAL_Enter returns %d\n", palError);
    return palError;
}